

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::savedashinput(Forth *this)

{
  Cell CVar1;
  structSavedInput local_60;
  
  requireDStackAvailable(this,2,"SAVE-INPUT");
  local_60.interpretState_ = InterpretSource;
  local_60.inputBufferStringsCurrent_ = 0;
  local_60.SourceBufferOffset_ = 0;
  local_60.SourceBufferAddress_ = 0;
  local_60.SourceBufferSize_ = 0;
  local_60.next_ = 0;
  local_60.SourceDashId_ = 0;
  local_60.blk = 0;
  local_60.InputBufferSourceSavedBy_ = fromFile;
  local_60.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60.inputBufferStrings_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_60._68_8_ = 0;
  saveInput(this,&local_60,false);
  CVar1 = this->saveInputVectorLastSaved + 1;
  this->saveInputVectorLastSaved = CVar1;
  local_60.saveId = CVar1;
  std::vector<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
  ::push_back(&this->savedInputVector,&local_60);
  ForthStack<unsigned_int>::push(&this->dStack,this->saveInputVectorLastSaved);
  ForthStack<unsigned_int>::push(&this->dStack,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.inputBufferStrings_);
  return;
}

Assistant:

void savedashinput() {
				REQUIRE_DSTACK_AVAILABLE(2, "SAVE-INPUT");
				struct structSavedInput save {};
				saveInput(save, false);
				++saveInputVectorLastSaved;
				save.saveId = saveInputVectorLastSaved;
				savedInputVector.push_back(save);
				push(saveInputVectorLastSaved);
				push(1);
		}